

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
llvm::SmallVectorImpl<char>::erase(SmallVectorImpl<char> *this,const_iterator CS,const_iterator CE)

{
  void *pvVar1;
  size_t sVar2;
  char *pcVar3;
  iterator I;
  iterator N;
  iterator E;
  iterator S;
  const_iterator CE_local;
  const_iterator CS_local;
  SmallVectorImpl<char> *this_local;
  
  if (CS < (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX) {
    __assert_fail("S >= this->begin() && \"Range to erase is out of bounds.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d1,
                  "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
                 );
  }
  if (CE < CS) {
    __assert_fail("S <= E && \"Trying to erase invalid range.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d2,
                  "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
                 );
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  if ((const_iterator)((long)pvVar1 + sVar2) < CE) {
    __assert_fail("E <= this->end() && \"Trying to erase past the end.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d3,
                  "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
                 );
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  pcVar3 = std::move<char*,char*>(CE,(char *)((long)pvVar1 + sVar2),CS);
  pvVar1 = (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<char,_true>::destroy_range(pcVar3,(char *)((long)pvVar1 + sVar2));
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (long)pcVar3 -
             (long)(this->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  return CS;
}

Assistant:

iterator erase(const_iterator CS, const_iterator CE) {
    // Just cast away constness because this is a non-const member function.
    iterator S = const_cast<iterator>(CS);
    iterator E = const_cast<iterator>(CE);

    assert(S >= this->begin() && "Range to erase is out of bounds.");
    assert(S <= E && "Trying to erase invalid range.");
    assert(E <= this->end() && "Trying to erase past the end.");

    iterator N = S;
    // Shift all elts down.
    iterator I = std::move(E, this->end(), S);
    // Drop the last elts.
    this->destroy_range(I, this->end());
    this->set_size(I - this->begin());
    return(N);
  }